

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O0

string * __thiscall
cli::getPrettyVersion_abi_cxx11_(string *__return_storage_ptr__,cli *this,Version version)

{
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  Version version_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1.0",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettyVersion(ZAP::Version version)
	{
		switch (version)
		{
		case ZAP::Version::V1_0: return "1.0";
		default: return "Unknown";
		}
	}